

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O1

MemChunk * __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::treeMalloc
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,size_type size)

{
  SmallMemChunk *chunk;
  SmallMemChunk *pSVar1;
  SmallMemChunk *pSVar2;
  uint uVar3;
  int iVar4;
  SmallMemChunk *curr;
  ulong uVar5;
  undefined4 extraout_var;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  size_type actualSize;
  size_type local_38;
  MemChunk *pMVar6;
  
  uVar7 = (uint)(size >> 8);
  if (uVar7 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0x1f;
    if (uVar7 < 0x10000) {
      uVar3 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar5 = (ulong)((uint)((size >> ((ulong)(byte)(0x26 - (char)(uVar3 ^ 0x1f)) & 0x3f) & 1) != 0)
                      + (uVar3 ^ 0x1f) * 2 ^ 0x3e);
    }
  }
  local_38 = size;
  if ((uint)uVar5 < 0x20) {
    pMVar6 = (MemChunk *)0x0;
    lVar9 = uVar5 << 3;
    do {
      if (*(long *)((long)&this->m_largeTrees[0].m_root + lVar9) == 0) {
        bVar10 = false;
      }
      else {
        iVar4 = PtrAVLTree::remove((PtrAVLTree *)((long)&this->m_largeTrees[0].m_root + lVar9),
                                   (char *)&local_38);
        pMVar6 = (MemChunk *)CONCAT44(extraout_var,iVar4);
        bVar10 = pMVar6 != (MemChunk *)0x0;
      }
    } while ((!bVar10) && (bVar10 = lVar9 != 0xf8, lVar9 = lVar9 + 8, bVar10));
  }
  else {
    pMVar6 = (MemChunk *)0x0;
  }
  if (pMVar6 == (MemChunk *)0x0) {
    pMVar6 = (MemChunk *)0x0;
  }
  else {
    uVar5 = pMVar6->m_size & 0xfffffffffffffff0;
    uVar8 = uVar5 - size;
    if (0x1f < uVar8) {
      chunk = (SmallMemChunk *)((long)&pMVar6->m_prevFootSize + size);
      pMVar6->m_size = size;
      *(size_type *)((long)&pMVar6->m_prevFootSize + size) = size;
      *(ulong *)((long)&pMVar6->m_size + size) = uVar8;
      *(ulong *)((long)&pMVar6->m_prevFootSize + uVar5) = uVar8;
      if (uVar8 < 0x100) {
        uVar7 = (uint)(uVar8 >> 3) & 0x1e;
        pSVar1 = this->m_smallLists[uVar7].m_head;
        if (pSVar1 == (SmallMemChunk *)0x0) {
          chunk->next = chunk;
          chunk->prev = chunk;
          this->m_smallLists[uVar7].m_head = chunk;
        }
        else {
          pSVar2 = pSVar1->next;
          pSVar1->next = chunk;
          pSVar2->prev = chunk;
          chunk->next = pSVar2;
          chunk->prev = pSVar1;
        }
        if ((this->m_smallMap >> uVar7 & 1) == 0) {
          this->m_smallMap = this->m_smallMap | 1 << (sbyte)uVar7;
        }
      }
      else {
        addLargeChunk(this,(MemChunk *)chunk);
      }
    }
  }
  return pMVar6;
}

Assistant:

inline MemChunk*
    treeMalloc (size_type size)
    {
        MemChunk* chunk = nullptr;
        size_type  actualSize = size;

        BinIndexType binIndex;
        cookmem_getLargeBinIndex (size, binIndex);

        for (; binIndex < NTREEBINS; ++binIndex)
        {
            PtrAVLTree& tree = treeAt(binIndex);
            if (!tree.isEmpty ())
            {
                chunk = reinterpret_cast<MemChunk*>(tree.remove(actualSize));
                if (chunk != nullptr)
                    break;
            }
        }

        if (chunk != nullptr)
        {
            return splitChunk (chunk, size);
        }
        return nullptr;
    }